

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotor::ConstraintsBiLoad_C
          (ChShaftsMotor *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar4 [16];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = factor;
  if (this->motor_mode != MOT_MODE_TORQUE) {
    auVar3 = auVar5._0_16_;
    dVar2 = 0.0;
    if (this->motor_mode == MOT_MODE_ROTATION) {
      (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
        _vptr_ChObj[0x40])(this);
      dVar2 = dVar2 - this->motor_set_rot;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = factor;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i;
    auVar3 = vfmadd213sd_fma(auVar4,auVar3,auVar1);
    (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = auVar3._0_8_;
  }
  return;
}

Assistant:

void ChShaftsMotor::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // if (!IsActive())
    //	return;
    if (motor_mode != MOT_MODE_TORQUE) {
        double res = 0;

        if (motor_mode == MOT_MODE_SPEED)
            res = 0;  // no need to stabilize positions

        if (motor_mode == MOT_MODE_ROTATION)
            res = GetMotorRot() - motor_set_rot;

        constraint.Set_b_i(constraint.Get_b_i() + factor * res);
    }
}